

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

_Bool fnet_socket_select(fnet_socket_t *sockets,size_t num,fnet_socket_t *rs,size_t *rs_num,
                        fnet_socket_t *es,size_t *es_num,size_t msec)

{
  uint uVar1;
  int iVar2;
  long *in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  long *in_R9;
  timeval tVar3;
  size_t in_stack_00000008;
  size_t i_3;
  size_t esi;
  size_t rsi;
  int ret;
  timeval timeout;
  size_t i_2;
  fd_set *__arr_1;
  uint __i_1;
  size_t i_1;
  fd_set *__arr;
  uint __i;
  size_t i;
  fnet_socket_t nfds;
  fd_set exceptfds;
  fd_set readfds;
  timeval *local_1e8;
  fd_set *local_1d8;
  fd_set *local_1c8;
  uint local_1bc;
  ulong local_1b8;
  long local_1b0;
  long local_1a8;
  __time_t local_198;
  __suseconds_t local_190;
  timeval local_188;
  ulong local_178;
  fd_set *local_170;
  uint local_164;
  ulong local_160;
  fd_set *local_158;
  uint local_14c;
  ulong local_148;
  uint local_13c;
  fd_set local_138;
  fd_set local_b8;
  long *local_38;
  long local_30;
  long *local_28;
  long local_20;
  ulong local_18;
  long local_10;
  _Bool local_1;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_1 = false;
  }
  else if ((in_RDX == 0) && (in_R8 == 0)) {
    local_1 = false;
  }
  else if ((in_RDX == 0) || (in_RCX != (long *)0x0)) {
    if ((in_R8 == 0) || (in_R9 != (long *)0x0)) {
      local_13c = 0;
      for (local_148 = 0; local_148 < in_RSI; local_148 = local_148 + 1) {
        if (local_13c < *(uint *)(in_RDI + local_148 * 4)) {
          local_1bc = *(uint *)(in_RDI + local_148 * 4);
        }
        else {
          local_1bc = local_13c;
        }
        local_13c = local_1bc;
      }
      local_38 = in_R9;
      local_30 = in_R8;
      local_28 = in_RCX;
      local_20 = in_RDX;
      local_18 = in_RSI;
      local_10 = in_RDI;
      if (in_RDX != 0) {
        local_158 = &local_b8;
        for (local_14c = 0; local_14c < 0x10; local_14c = local_14c + 1) {
          local_158->fds_bits[local_14c] = 0;
        }
        for (local_160 = 0; local_160 < local_18; local_160 = local_160 + 1) {
          uVar1 = *(uint *)(local_10 + local_160 * 4) >> 6;
          local_b8.fds_bits[uVar1] =
               1L << ((byte)*(undefined4 *)(local_10 + local_160 * 4) & 0x3f) |
               local_b8.fds_bits[uVar1];
        }
        *local_28 = 0;
      }
      if (local_30 != 0) {
        local_170 = &local_138;
        for (local_164 = 0; local_164 < 0x10; local_164 = local_164 + 1) {
          local_170->fds_bits[local_164] = 0;
        }
        for (local_178 = 0; local_178 < local_18; local_178 = local_178 + 1) {
          uVar1 = *(uint *)(local_10 + local_178 * 4) >> 6;
          local_138.fds_bits[uVar1] =
               1L << ((byte)*(undefined4 *)(local_10 + local_178 * 4) & 0x3f) |
               local_138.fds_bits[uVar1];
        }
        *local_38 = 0;
      }
      if (in_stack_00000008 != 0xffffffffffffffff) {
        tVar3 = msec2timeval(in_stack_00000008);
        local_198 = tVar3.tv_sec;
        local_188.tv_sec = local_198;
        local_190 = tVar3.tv_usec;
        local_188.tv_usec = local_190;
      }
      if (local_20 == 0) {
        local_1c8 = (fd_set *)0x0;
      }
      else {
        local_1c8 = &local_b8;
      }
      if (local_30 == 0) {
        local_1d8 = (fd_set *)0x0;
      }
      else {
        local_1d8 = &local_138;
      }
      if (in_stack_00000008 == 0xffffffffffffffff) {
        local_1e8 = (timeval *)0x0;
      }
      else {
        local_1e8 = &local_188;
      }
      iVar2 = select(local_13c + 1,local_1c8,(fd_set *)0x0,local_1d8,local_1e8);
      if (iVar2 < 0) {
        local_1 = false;
      }
      else {
        local_1a8 = 0;
        local_1b0 = 0;
        for (local_1b8 = 0; local_1b8 < local_18; local_1b8 = local_1b8 + 1) {
          if ((local_20 != 0) &&
             ((local_b8.fds_bits[*(uint *)(local_10 + local_1b8 * 4) >> 6] &
              1L << ((byte)*(undefined4 *)(local_10 + local_1b8 * 4) & 0x3f)) != 0)) {
            *(undefined4 *)(local_20 + local_1a8 * 4) = *(undefined4 *)(local_10 + local_1b8 * 4);
            local_1a8 = local_1a8 + 1;
          }
          if ((local_30 != 0) &&
             ((local_138.fds_bits[*(uint *)(local_10 + local_1b8 * 4) >> 6] &
              1L << ((byte)*(undefined4 *)(local_10 + local_1b8 * 4) & 0x3f)) != 0)) {
            *(undefined4 *)(local_30 + local_1b0 * 4) = *(undefined4 *)(local_10 + local_1b8 * 4);
            local_1b0 = local_1b0 + 1;
          }
        }
        if (local_28 != (long *)0x0) {
          *local_28 = local_1a8;
        }
        if (local_38 != (long *)0x0) {
          *local_38 = local_1b0;
        }
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool fnet_socket_select(fnet_socket_t *sockets,
                        size_t num,
                        fnet_socket_t *rs,
                        size_t *rs_num,
                        fnet_socket_t *es,
                        size_t *es_num,
                        size_t msec)
{
    if (!sockets || !num)   return false;
    if (!rs && !es)         return false;
    if (rs && !rs_num)      return false;
    if (es && !es_num)      return false;

    fd_set readfds;
    fd_set exceptfds;
    fnet_socket_t nfds = 0;

    for(size_t i = 0; i < num; ++i)
        nfds = nfds < sockets[i] ? sockets[i] : nfds;

    if (rs)
    {
        FD_ZERO(&readfds);
        for(size_t i = 0; i < num; ++i)
            FD_SET(sockets[i], &readfds);
        *rs_num = 0;
    }

    if (es)
    {
        FD_ZERO(&exceptfds);
        for(size_t i = 0; i < num; ++i)
            FD_SET(sockets[i], &exceptfds);
        *es_num = 0;
    }

    struct timeval timeout;
    if (msec != (size_t)-1)
        timeout = msec2timeval(msec);

    int ret = select(nfds + 1, rs ? &readfds : 0, 0, es ? &exceptfds : 0, msec != (size_t)-1 ? &timeout : 0);
    if (ret < 0)
    {
        FLOG_ERR("Socket waiting was failed");
        return false;
    }

    size_t rsi = 0;
    size_t esi = 0;

    for(size_t i = 0; i < num; ++i)
    {
        if (rs && FD_ISSET(sockets[i], &readfds))
            rs[rsi++] = sockets[i];
        if (es && FD_ISSET(sockets[i], &exceptfds))
            es[esi++] = sockets[i];
    }

    if (rs_num) *rs_num = rsi;
    if (es_num) *es_num = esi;
    return true;
}